

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

void __thiscall
OpenMD::NameFinder::matchRigidAtoms
          (NameFinder *this,string *molName,string *rbName,string *rbAtomName,SelectionSet *bs)

{
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  rbNodes;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  molNodes;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  rbAtomNodes;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_a8;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_90;
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_48;
  
  std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &(this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>);
  getMatchedChildren(&local_90,this,(TreeNodePtr *)&local_58,molName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  for (p_Var2 = &(local_90.
                  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != &(local_90.
                  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_68,p_Var2);
    getMatchedChildren(&local_a8,this,(TreeNodePtr *)&local_68,rbName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    for (p_Var1 = &(local_a8.
                    super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
        p_Var1 != &(local_a8.
                    super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
        p_Var1 = p_Var1 + 1) {
      std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_78,p_Var1);
      getMatchedChildren(&local_48,this,(TreeNodePtr *)&local_78,rbAtomName);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      for (psVar3 = local_48.
                    super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar3 != local_48.
                    super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
        SelectionSet::orOperator
                  (bs,&((psVar3->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->bs);
      }
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::~vector(&local_48);
    }
    std::
    vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
    ~vector(&local_a8);
  }
  std::
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
  ~vector(&local_90);
  return;
}

Assistant:

void NameFinder::matchRigidAtoms(const std::string& molName,
                                   const std::string& rbName,
                                   const std::string& rbAtomName,
                                   SelectionSet& bs) {
    std::vector<TreeNodePtr> molNodes = getMatchedChildren(root_, molName);
    std::vector<TreeNodePtr>::iterator i;
    for (i = molNodes.begin(); i != molNodes.end(); ++i) {
      std::vector<TreeNodePtr> rbNodes = getMatchedChildren(*i, rbName);
      std::vector<TreeNodePtr>::iterator j;
      for (j = rbNodes.begin(); j != rbNodes.end(); ++j) {
        std::vector<TreeNodePtr> rbAtomNodes =
            getMatchedChildren(*j, rbAtomName);
        std::vector<TreeNodePtr>::iterator k;
        for (k = rbAtomNodes.begin(); k != rbAtomNodes.end(); ++k) {
          bs |= (*k)->bs;
        }
      }
    }
  }